

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O1

LineParameters
deqp::gls::theilSenLinearRegression
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dataPoints)

{
  pointer pVVar1;
  pointer pVVar2;
  LineParameters LVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined8 uVar10;
  undefined1 auVar9 [16];
  vector<float,_std::allocator<float>_> pointwiseOffsets;
  vector<float,_std::allocator<float>_> pairwiseCoefficients;
  float local_ac;
  undefined1 local_a8 [16];
  float *local_98;
  undefined1 local_88 [16];
  float *local_78;
  undefined1 local_68 [16];
  ulong local_50;
  ulong local_48;
  uint uStack_40;
  uint uStack_3c;
  
  local_50 = (ulong)((long)(dataPoints->
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(dataPoints->
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_78 = (float *)0x0;
  auVar8 = ZEXT816(0);
  local_98 = (float *)0x0;
  local_68 = ZEXT816(0);
  local_a8 = auVar8;
  local_88 = auVar8;
  if (0 < (int)(uint)local_50) {
    local_48 = (ulong)((uint)local_50 & 0x7fffffff);
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        pVVar1 = (dataPoints->
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          pVVar2 = (dataPoints->
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          fVar7 = pVVar1[uVar5].m_data[0] - pVVar2[uVar6].m_data[0];
          auVar8._0_4_ = -fVar7;
          auVar8._4_4_ = 0x80000000;
          auVar8._8_4_ = 0x80000000;
          auVar8._12_4_ = 0x80000000;
          if (auVar8._0_4_ <= fVar7) {
            auVar8._0_4_ = fVar7;
          }
          if (1e-06 < auVar8._0_4_) {
            local_ac = pVVar1[uVar5].m_data[0] - pVVar2[uVar6].m_data[0];
            auVar8 = ZEXT416((uint)local_ac);
            local_ac = (pVVar1[uVar5].m_data[1] - pVVar2[uVar6].m_data[1]) / local_ac;
            if ((float *)local_88._8_8_ == local_78) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        ((vector<float,_std::allocator<float>_> *)local_88,(iterator)local_88._8_8_,
                         &local_ac);
            }
            else {
              *(float *)local_88._8_8_ = local_ac;
              local_88._8_8_ = (float *)(local_88._8_8_ + 4);
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_48);
  }
  uVar5 = local_50;
  if (local_88._0_8_ != local_88._8_8_) {
    fVar7 = destructiveMedian<float>((vector<float,_std::allocator<float>_> *)local_88);
    auVar8 = ZEXT416((uint)fVar7) << 0x20;
    local_68 = auVar8;
  }
  uVar10 = auVar8._8_8_;
  if (0 < (int)(uint)uVar5) {
    uStack_40 = local_68._4_4_ ^ 0x80000000;
    uStack_3c = local_68._4_4_ ^ 0x80000000;
    local_48 = CONCAT44(local_68._4_4_,local_68._4_4_) ^ 0x8000000080000000;
    uVar6 = 0;
    do {
      pVVar1 = (dataPoints->
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_ac = pVVar1[uVar6].m_data[0] * (float)local_48 + pVVar1[uVar6].m_data[1];
      if ((float *)local_a8._8_8_ == local_98) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)local_a8,(iterator)local_a8._8_8_,
                   &local_ac);
      }
      else {
        *(float *)local_a8._8_8_ = local_ac;
        local_a8._8_8_ = (float *)(local_a8._8_8_ + 4);
      }
      uVar10 = auVar8._8_8_;
      uVar6 = uVar6 + 1;
    } while (((uint)uVar5 & 0x7fffffff) != uVar6);
  }
  if (local_a8._0_8_ != local_a8._8_8_) {
    fVar7 = destructiveMedian<float>((vector<float,_std::allocator<float>_> *)local_a8);
    auVar4._4_8_ = uVar10;
    auVar4._0_4_ = local_68._4_4_;
    auVar9._0_8_ = auVar4._0_8_ << 0x20;
    auVar9._8_4_ = local_68._8_4_;
    auVar9._12_4_ = local_68._12_4_;
    local_68._4_12_ = auVar9._4_12_;
    local_68._0_4_ = fVar7;
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  LVar3.offset = (float)local_68._0_4_;
  LVar3.coefficient = (float)local_68._4_4_;
  return LVar3;
}

Assistant:

LineParameters theilSenLinearRegression (const std::vector<tcu::Vec2>& dataPoints)
{
	const float		epsilon					= 1e-6f;

	const int		numDataPoints			= (int)dataPoints.size();
	vector<float>	pairwiseCoefficients;
	vector<float>	pointwiseOffsets;
	LineParameters	result					(0.0f, 0.0f);

	// Compute the pairwise coefficients.
	for (int i = 0; i < numDataPoints; i++)
	{
		const Vec2& ptA = dataPoints[i];

		for (int j = 0; j < i; j++)
		{
			const Vec2& ptB = dataPoints[j];

			if (de::abs(ptA.x() - ptB.x()) > epsilon)
				pairwiseCoefficients.push_back((ptA.y() - ptB.y()) / (ptA.x() - ptB.x()));
		}
	}

	// Find the median of the pairwise coefficients.
	// \note If there are no data point pairs with differing x values, the coefficient variable will stay zero as initialized.
	if (!pairwiseCoefficients.empty())
		result.coefficient = destructiveMedian(pairwiseCoefficients);

	// Compute the offsets corresponding to the median coefficient, for all data points.
	for (int i = 0; i < numDataPoints; i++)
		pointwiseOffsets.push_back(dataPoints[i].y() - result.coefficient*dataPoints[i].x());

	// Find the median of the offsets.
	// \note If there are no data points, the offset variable will stay zero as initialized.
	if (!pointwiseOffsets.empty())
		result.offset = destructiveMedian(pointwiseOffsets);

	return result;
}